

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GLSL420Pack::BindingSamplerInvalidTest::getCaseString
          (BindingSamplerInvalidTest *this,TESTCASES test_case)

{
  TestError *this_00;
  char *local_20;
  GLchar *binding;
  TESTCASES test_case_local;
  BindingSamplerInvalidTest *this_local;
  
  switch(this->m_case) {
  case NEGATIVE_VALUE:
    local_20 = "= -1";
    break;
  case VARIABLE_NAME:
    local_20 = "= goku";
    break;
  case STD140:
    local_20 = "= std140";
    break;
  case MISSING:
    local_20 = "";
    break;
  case TEST_CASES_MAX:
    local_20 = "= 0";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x2d3f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_20;
}

Assistant:

const GLchar* BindingSamplerInvalidTest::getCaseString(TESTCASES test_case)
{
	(void)test_case;
	const GLchar* binding = 0;

	switch (m_case)
	{
	case NEGATIVE_VALUE:
		binding = "= -1";
		break;
	case VARIABLE_NAME:
		binding = "= goku";
		break;
	case STD140:
		binding = "= std140";
		break;
	case MISSING:
		binding = "";
		break;
	case TEST_CASES_MAX:
		binding = "= 0";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return binding;
}